

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O3

int http_parser_parse_url(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  uint16_t *puVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  state s;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  uint16_t uVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  long lVar13;
  uint16_t uVar14;
  int iVar15;
  uint uVar16;
  char *pcVar17;
  
  if (buflen != 0) {
    u->field_set = 0;
    u->port = 0;
    if ((long)buflen < 1) {
      return (uint)(is_connect != 0);
    }
    s = (uint)(is_connect != 0) * 4 + s_req_spaces_before_url;
    uVar16 = 7;
    lVar13 = 0;
    uVar10 = 0;
    bVar3 = false;
    do {
      s = parse_url_char(s,buf[lVar13]);
      switch(s) {
      case s_req_schema:
        uVar6 = 0;
        break;
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        goto switchD_0010a861_caseD_16;
      case s_req_server:
        uVar6 = 1;
        break;
      case s_req_server_with_at:
        uVar6 = 1;
        bVar3 = true;
        break;
      case s_req_path:
        uVar6 = 3;
        break;
      case s_req_query_string:
        uVar6 = 4;
        break;
      case s_req_fragment:
        uVar6 = 5;
        break;
      default:
        if (s != s_dead) {
          __assert_fail("!\"Unexpected state\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/lib/cio/http-parser/http_parser.c"
                        ,0x9a9,
                        "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)"
                       );
        }
        return 1;
      }
      if (uVar6 == uVar16) {
        puVar1 = &u->field_data[uVar16].len;
        *puVar1 = *puVar1 + 1;
      }
      else {
        u->field_data[uVar6].off = (uint16_t)lVar13;
        u->field_data[uVar6].len = 1;
        uVar10 = uVar10 | 1 << uVar6;
        u->field_set = (uint16_t)uVar10;
        uVar16 = uVar6;
      }
switchD_0010a861_caseD_16:
      lVar4 = lVar13 + 1;
      lVar13 = lVar13 + 1;
    } while (buf + lVar4 < buf + buflen);
    uVar12 = (ushort)uVar10;
    if ((uVar12 & 3) != 1) {
      if ((uVar10 & 2) != 0) {
        iVar15 = (uint)!bVar3 * 2 + 2;
        uVar11 = (ulong)u->field_data[1].len;
        uVar7 = (ulong)u->field_data[1].off;
        u->field_data[1].len = 0;
        if (uVar11 != 0) {
          lVar13 = uVar11 + uVar7;
          uVar9 = 0;
          do {
            bVar2 = buf[uVar7];
            switch((long)&switchD_0010a96b::switchdataD_0010ce38 +
                   (long)(int)(&switchD_0010a96b::switchdataD_0010ce38)[iVar15 - 2]) {
            case 0x10a96e:
              iVar5 = 4;
              if (bVar2 != 0x40) {
                if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 | 0x20) + 0x9f))) &&
                    ((0x3e < bVar2 - 0x21 ||
                     ((0x4000000016003ff9U >> ((ulong)(bVar2 - 0x21) & 0x3f) & 1) == 0)))) &&
                   (bVar2 != 0x7e)) {
                  return 1;
                }
                if (iVar15 == 3) {
                  uVar14 = u->field_data[6].len + 1;
                }
                else {
                  u->field_data[6].off = (uint16_t)uVar7;
                  uVar10 = uVar10 | 0x40;
                  u->field_set = (uint16_t)uVar10;
                  uVar14 = 1;
                }
                u->field_data[6].len = uVar14;
                iVar5 = 3;
              }
              break;
            case 0x10a9ed:
              iVar5 = 5;
              if (bVar2 != 0x5b) {
                if ((0x19 < (byte)((bVar2 | 0x20) + 0x9f)) &&
                   (1 < (byte)(bVar2 - 0x2d) && 9 < (byte)(bVar2 - 0x30))) {
                  return 1;
                }
                u->field_data[1].off = (uint16_t)uVar7;
                uVar9 = uVar9 + 1;
                u->field_data[1].len = uVar9;
                iVar5 = 6;
              }
            }
            iVar15 = iVar5;
            uVar12 = (ushort)uVar10;
            lVar4 = uVar7 + 1;
            uVar7 = uVar7 + 1;
          } while (buf + lVar4 < buf + lVar13);
        }
        if ((iVar15 - 2U < 10) && ((0x3afU >> (iVar15 - 2U & 0x1f) & 1) != 0)) {
          return 1;
        }
      }
      if (is_connect == 0) {
        if ((uVar12 & 4) == 0) {
          return 0;
        }
      }
      else if (uVar12 != 6) {
        return 1;
      }
      uVar11 = (ulong)u->field_data[2].off;
      uVar12 = u->field_data[2].len;
      if (uVar12 + uVar11 <= buflen) {
        if (uVar12 == 0) {
          uVar11 = 0;
        }
        else {
          pcVar17 = buf + uVar11;
          pcVar8 = pcVar17 + uVar12;
          uVar11 = 0;
          do {
            uVar11 = ((long)*pcVar17 + uVar11 * 10) - 0x30;
            if (0xffff < uVar11) {
              return 1;
            }
            pcVar17 = pcVar17 + 1;
          } while (pcVar17 < pcVar8);
        }
        u->port = (uint16_t)uVar11;
        return 0;
      }
      __assert_fail("off + len <= buflen && \"Port number overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/lib/cio/http-parser/http_parser.c"
                    ,0x9d8,
                    "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)"
                   );
    }
  }
  return 1;
}

Assistant:

int
http_parser_parse_url(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  if (buflen == 0) {
    return 1;
  }

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* fall through */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = (uint16_t)(p - buf);
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & (1 << UF_SCHEMA)) &&
      (u->field_set & (1 << UF_HOST)) == 0) {
    return 1;
  }

  if (u->field_set & (1 << UF_HOST)) {
    if (http_parse_host(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    uint16_t off;
    uint16_t len;
    const char* p;
    const char* end;
    unsigned long v;

    off = u->field_data[UF_PORT].off;
    len = u->field_data[UF_PORT].len;
    end = buf + off + len;

    /* NOTE: The characters are already validated and are in the [0-9] range */
    assert(off + len <= buflen && "Port number overflow");
    v = 0;
    for (p = buf + off; p < end; p++) {
      v *= 10;
      v += *p - '0';

      /* Ports have a max value of 2^16 */
      if (v > 0xffff) {
        return 1;
      }
    }

    u->port = (uint16_t) v;
  }

  return 0;
}